

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::PathTypeHandlerBase::PreventExtensions(PathTypeHandlerBase *this,DynamicObject *instance)

{
  int *piVar1;
  DynamicType *type;
  PathTypeSuccessorInfo *this_00;
  DynamicType *pDVar2;
  DynamicTypeHandler *this_01;
  ScriptContext *scriptContext;
  Recycler *recycler;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  BOOL BVar6;
  undefined4 extraout_var;
  DictionaryTypeHandlerBase<unsigned_short> *pDVar7;
  undefined4 *puVar8;
  undefined4 extraout_var_00;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *this_02;
  RecyclerWeakReferenceBase *weakRef;
  DynamicType *newType;
  PathTypeSuccessorKey local_40;
  PathTypeSuccessorKey key;
  RecyclerWeakReference<Js::DynamicType> *newTypeWeakRef;
  
  piVar1 = &((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr)->convertPathToDictionaryExtensionsCount
  ;
  *piVar1 = *piVar1 + 1;
  iVar5 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6f])();
  if (CONCAT44(extraout_var,iVar5) != 0) {
    pDVar7 = ConvertToTypeHandler<Js::DictionaryTypeHandlerBase<unsigned_short>>(this,instance);
    iVar5 = (*(pDVar7->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x36])(pDVar7,instance);
    return iVar5;
  }
  key.propertyId = 0;
  key.attributes = ObjectSlotAttr_None;
  key._5_3_ = 0;
  type = (DynamicType *)(instance->super_RecyclableObject).type.ptr;
  PathTypeSuccessorKey::PathTypeSuccessorKey
            (&local_40,InternalPropertyRecords::NonExtensibleType._8_4_,ObjectSlotAttr_Default);
  this_00 = (this->successorInfo).ptr;
  if (this_00 == (PathTypeSuccessorInfo *)0x0) {
    key.propertyId = 0;
    key.attributes = ObjectSlotAttr_None;
    key._5_3_ = 0;
  }
  else {
    bVar4 = PathTypeSuccessorInfo::GetSuccessor
                      (this_00,local_40,(RecyclerWeakReference<Js::DynamicType> **)&key);
    if ((bVar4) && (pDVar2 = *(DynamicType **)key, pDVar2 != (DynamicType *)0x0)) {
      this_01 = (pDVar2->typeHandler).ptr;
      DynamicType::ShareType(pDVar2);
      DynamicTypeHandler::SetFlags(this_01,(this->super_DynamicTypeHandler).flags & 0x20);
      iVar5 = (*this_01->_vptr_DynamicTypeHandler[0x59])(this_01);
      if ((char)iVar5 != '\0') {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                    ,0x577,"(!newTypeHandler->HasSingletonInstance())",
                                    "!newTypeHandler->HasSingletonInstance()");
        if (!bVar4) goto LAB_00dbfe8e;
        *puVar8 = 0;
      }
      bVar4 = DynamicObject::IsObjectHeaderInlinedTypeHandler(instance);
      if (bVar4) {
        DynamicTypeHandler::AdjustSlots
                  (instance,this_01->inlineSlotCapacity,
                   this_01->slotCapacity - (uint)this_01->inlineSlotCapacity);
      }
      DynamicTypeHandler::ReplaceInstanceType(instance,pDVar2);
      BVar6 = 1;
      goto LAB_00dbfe05;
    }
  }
  iVar5 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6f])(this);
  if (CONCAT44(extraout_var_00,iVar5) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x55a,"(CanConvertToSimpleDictionaryType())",
                                "CanConvertToSimpleDictionaryType()");
    if (!bVar4) goto LAB_00dbfe8e;
    *puVar8 = 0;
  }
  this_02 = ConvertToSimpleDictionaryType<Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>>
                      (this,instance,(uint)((this->super_DynamicTypeHandler).unusedBytes >> 1),true)
  ;
  if (((this_02->super_DynamicTypeHandler).flags & 0x18) != 8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x560,
                                "(newTypeHandler->GetMayBecomeShared() && !newTypeHandler->GetIsShared())"
                                ,
                                "newTypeHandler->GetMayBecomeShared() && !newTypeHandler->GetIsShared()"
                               );
    if (!bVar4) goto LAB_00dbfe8e;
    *puVar8 = 0;
  }
  pDVar2 = (DynamicType *)(instance->super_RecyclableObject).type.ptr;
  DynamicType::LockType(pDVar2);
  if (pDVar2->isShared == true) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x563,"(!newType->GetIsShared())","!newType->GetIsShared()");
    if (!bVar4) goto LAB_00dbfe8e;
    *puVar8 = 0;
  }
  scriptContext =
       (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  recycler = scriptContext->recycler;
  weakRef = Memory::WeakReferenceHashTable<PrimePolicy>::Add
                      (&recycler->weakReferenceMap,(char *)pDVar2,recycler);
  if (weakRef->typeInfo == (Type)0x0) {
    weakRef->typeInfo = (Type)&DynamicType::typeinfo;
    Memory::Recycler::TrackAllocWeakRef(recycler,weakRef);
  }
  SetSuccessor(this,type,local_40,(RecyclerWeakReference<Js::DynamicType> *)weakRef,scriptContext);
  BVar6 = SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>::
          PreventExtensionsInternal(this_02,instance);
  if (BVar6 != 0) {
LAB_00dbfe05:
    bVar4 = DynamicObject::HasObjectArray(instance);
    if (*(long **)&(instance->field_1).field_1 != (long *)0x0 && bVar4) {
      (**(code **)(**(long **)&(instance->field_1).field_1 + 0x1a8))();
    }
    return BVar6;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar8 = 1;
  bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                              ,0x50a,"(tempResult)","tempResult");
  if (bVar4) {
    *puVar8 = 0;
    return 0;
  }
LAB_00dbfe8e:
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

BOOL PathTypeHandlerBase::PreventExtensions(DynamicObject* instance)
    {
#ifdef PROFILE_TYPES
        instance->GetScriptContext()->convertPathToDictionaryExtensionsCount++;
#endif
        if (!CanConvertToSimpleDictionaryType())
        {
            return ConvertToDictionaryType(instance)->PreventExtensions(instance);
        }

        BOOL tempResult = this->ConvertToSharedNonExtensibleTypeIfNeededAndCallOperation(instance, InternalPropertyRecords::NonExtensibleType,
            [&](SimpleDictionaryTypeHandlerWithNonExtensibleSupport* newTypeHandler)
            {
                return newTypeHandler->PreventExtensionsInternal(instance);
            });

        Assert(tempResult);
        if (tempResult)
        {
            // Call preventExtensions on the objectArray -- which will create different type for array type handler.
            ArrayObject * objectArray = instance->GetObjectArray();
            if (objectArray)
            {
                objectArray->PreventExtensions();
            }
        }

        return tempResult;
    }